

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector_t * load_config(vector_t *__return_storage_ptr__,QString *file_name)

{
  char cVar1;
  file_format_t fVar2;
  logic_error *this;
  int column;
  int line;
  QDomDocument doc;
  parser_t<cfgfile::qstring_trait_t> parser;
  QFile file;
  QTextStream stream;
  determine_format_t<cfgfile::qstring_trait_t> d;
  tag_vector_t<cfgfile::qstring_trait_t> read_tag;
  int local_324;
  QDomDocument local_320 [8];
  string_t local_318;
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>_*,_false> local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>_*,_false> local_2e8 [3];
  QFile local_2d0 [16];
  QArrayData local_2c0;
  QArrayData *local_2b0;
  char16_t *local_2a8;
  qsizetype qStack_2a0;
  undefined1 local_298 [24];
  undefined1 local_280 [24];
  QString local_268;
  undefined1 local_250 [24];
  undefined1 local_238 [24];
  undefined1 local_220 [24];
  input_stream_t<cfgfile::qstring_trait_t> local_208;
  tag_vector_t<cfgfile::qstring_trait_t> local_108;
  
  cfg::tag_vector_t<cfgfile::qstring_trait_t>::tag_vector_t(&local_108);
  QFile::QFile(local_2d0,(QString *)file_name);
  cVar1 = QFile::open(local_2d0,1);
  if (cVar1 == '\0') {
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    QTextStream::QTextStream((QTextStream *)&local_2c0,(QIODevice *)local_2d0);
    local_318.m_str.d.d = (file_name->d).d;
    local_318.m_str.d.ptr = (file_name->d).ptr;
    local_318.m_str.d.size = (file_name->d).size;
    if (&(local_318.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_318.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_318.m_str.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208.m_stream = (istream_t *)&local_2c0;
    fVar2 = cfgfile::details::determine_format_t<cfgfile::qstring_trait_t>::format
                      ((determine_format_t<cfgfile::qstring_trait_t> *)&local_208);
    QTextStream::seek((longlong)&local_2c0);
    if (fVar2 == xml_format) {
      QDomDocument::QDomDocument(local_320);
      local_208.m_stream = (istream_t *)0x0;
      local_208.m_line_number = 0;
      local_208.m_column_number = 0;
      local_324 = 0;
      QTextStream::readAll();
      cVar1 = QDomDocument::setContent
                        ((QString *)local_320,SUB81(local_2e8,0),(QString *)0x1,(int *)&local_208,
                         &local_324);
      if (cVar1 == '\0') {
        this = (logic_error *)__cxa_allocate_exception(0x28);
        QString::QString(&local_268,
                         "Unable to parse XML from file: \"%1\". \"%2\" On line %3, column %4.");
        local_2b0 = &(local_318.m_str.d.d)->super_QArrayData;
        local_2a8 = local_318.m_str.d.ptr;
        qStack_2a0 = local_318.m_str.d.size;
        if (&(local_318.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_318.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_318.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        QString::arg((QString *)local_250,(int)&local_268,(QChar)(char16_t)&local_2b0);
        QString::arg((QString *)local_238,(int)local_250,(QChar)(char16_t)&local_208);
        QString::number((int)local_280,local_324);
        QString::arg((QString *)local_220,(int)local_238,(QChar)(char16_t)local_280);
        QString::number((int)local_298,0);
        QString::arg((QString *)&local_300,(int)local_220,(QChar)(char16_t)local_298);
        if (local_300._M_head_impl != (parser_base_t<cfgfile::qstring_trait_t> *)0x0) {
          LOCK();
          *(int *)&(local_300._M_head_impl)->_vptr_parser_base_t =
               *(int *)&(local_300._M_head_impl)->_vptr_parser_base_t + 1;
          UNLOCK();
        }
        std::logic_error::logic_error(this,"Please use desc() method of the exception.");
        *(undefined ***)this = &PTR__exception_t_00147670;
        *(undefined8 *)(this + 0x10) = 0;
        *(undefined8 *)(this + 0x18) = 0;
        *(parser_base_t<cfgfile::qstring_trait_t> **)(this + 0x10) = local_300._M_head_impl;
        *(undefined8 *)(this + 0x18) = local_2f8;
        *(undefined8 *)(this + 0x20) = local_2f0;
        __cxa_throw(this,&cfgfile::exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    cfgfile::exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
      cfgfile::parser_t<cfgfile::qstring_trait_t>::parser_t
                ((parser_t<cfgfile::qstring_trait_t> *)&local_300,
                 (tag_t<cfgfile::qstring_trait_t> *)&local_108,local_320);
      (*(local_300._M_head_impl)->_vptr_parser_base_t[2])(local_300._M_head_impl,&local_318);
      if (local_300._M_head_impl != (parser_base_t<cfgfile::qstring_trait_t> *)0x0) {
        (*(local_300._M_head_impl)->_vptr_parser_base_t[1])();
      }
      if (local_2e8[0]._M_head_impl != (parser_base_t<cfgfile::qstring_trait_t> *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_2e8[0]._M_head_impl)->_vptr_parser_base_t)->_q_value).
        super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_2e8[0]._M_head_impl)->_vptr_parser_base_t)->_q_value).
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_2e8[0]._M_head_impl)->_vptr_parser_base_t)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_2e8[0]._M_head_impl,2,8);
        }
      }
      if ((QArrayData *)local_208.m_stream != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_208.m_stream)->field_0x0)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(local_208.m_stream)->field_0x0)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_208.m_stream)->field_0x0)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_208.m_stream,2,8);
        }
      }
      QDomDocument::~QDomDocument(local_320);
    }
    else if (fVar2 == cfgfile_format) {
      cfgfile::input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
                (&local_208,&local_318,(istream_t *)&local_2c0);
      cfgfile::parser_t<cfgfile::qstring_trait_t>::parser_t
                ((parser_t<cfgfile::qstring_trait_t> *)local_2e8,
                 (tag_t<cfgfile::qstring_trait_t> *)&local_108,&local_208);
      (**(code **)(*(long *)&(local_2e8[0]._M_head_impl)->_vptr_parser_base_t + 0x10))
                (local_2e8[0]._M_head_impl,&local_318);
      if (local_2e8[0]._M_head_impl != (parser_base_t<cfgfile::qstring_trait_t> *)0x0) {
        (**(code **)(*(long *)&(local_2e8[0]._M_head_impl)->_vptr_parser_base_t + 8))();
      }
      cfgfile::input_stream_t<cfgfile::qstring_trait_t>::~input_stream_t(&local_208);
    }
    if (&(local_318.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_318.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_318.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_318.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_318.m_str.d.d)->super_QArrayData,2,8);
      }
    }
    QFileDevice::close();
    cfg::tag_vector_t<cfgfile::qstring_trait_t>::get_cfg(__return_storage_ptr__,&local_108);
    QTextStream::~QTextStream((QTextStream *)&local_2c0);
  }
  QFile::~QFile(local_2d0);
  local_108.super_tag_no_value_t<cfgfile::qstring_trait_t>.super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_vector_t_001474d8;
  cfgfile::tag_vector_of_tags_t<cfg::tag_tags_t<cfgfile::qstring_trait_t>,_cfgfile::qstring_trait_t>
  ::~tag_vector_of_tags_t(&local_108.m_vector);
  cfgfile::tag_t<cfgfile::qstring_trait_t>::~tag_t((tag_t<cfgfile::qstring_trait_t> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

cfg::vector_t load_config( const QString & file_name )
{
	cfg::tag_vector_t< cfgfile::qstring_trait_t > read_tag;

	QFile file( file_name );

	if( !file.open( QIODevice::ReadOnly ) )
		return cfg::vector_t();

	QTextStream stream( &file );

	try {
		cfgfile::read_cfgfile(
			read_tag, stream, file_name );

		file.close();
	}
	catch( const cfgfile::exception_t< cfgfile::qstring_trait_t > & )
	{
		file.close();

		throw;
	}

	return read_tag.get_cfg();
}